

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Put(Abc_Frame_t *pAbc,int argc,char **argv)

{
  float fVar1;
  Gia_Man_t *p;
  Abc_Obj_t *pAVar2;
  Vec_Flt_t *pVVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  Abc_Ntk_t *pNtk;
  Vec_Ptr_t *pVVar9;
  Aig_Man_t *pAVar10;
  Abc_Ntk_t *pNtkOld;
  char *pcVar11;
  char *pcVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  char pSuffix [100];
  uint local_a4;
  char local_98 [104];
  
  Abc_FrameReadNtk(pAbc);
  local_a4 = 0;
  Extra_UtilGetoptReset();
  bVar5 = true;
  bVar4 = false;
  bVar6 = false;
  do {
    while( true ) {
      while (iVar7 = Extra_UtilGetopt(argc,argv,"seovh"), iVar7 == 0x73) {
        bVar5 = (bool)(bVar5 ^ 1);
      }
      if (iVar7 < 0x6f) break;
      if (iVar7 == 0x6f) {
        local_a4 = local_a4 ^ 1;
      }
      else {
        if (iVar7 != 0x76) goto LAB_00274944;
        bVar6 = (bool)(bVar6 ^ 1);
      }
    }
    if (iVar7 == -1) {
      p = pAbc->pGia;
      if (p == (Gia_Man_t *)0x0) {
        pcVar11 = "Empty network.\n";
        iVar7 = -1;
        goto LAB_00274a2b;
      }
      if (bVar4) {
        iVar7 = 1;
LAB_00274a14:
        pNtk = Abc_NtkFromMappedGia(p,iVar7,local_a4);
      }
      else if (p->vCellMapping == (Vec_Int_t *)0x0) {
        if ((p->vMapping != (Vec_Int_t *)0x0) || (p->pMuxes != (uint *)0x0)) {
          iVar7 = 0;
          goto LAB_00274a14;
        }
        iVar7 = Gia_ManHasDangling(p);
        pAVar10 = Gia_ManToAig(pAbc->pGia,0);
        pNtkOld = Abc_NtkFromAigPhase(pAVar10);
        pcVar11 = Extra_UtilStrsav(pAVar10->pName);
        pNtkOld->pName = pcVar11;
        Aig_ManStop(pAVar10);
        pNtk = pNtkOld;
        if (iVar7 != 0) {
          pAVar10 = Gia_ManToAig(pAbc->pGia,1);
          pNtk = Abc_NtkFromDarChoices(pNtkOld,pAVar10);
          Abc_NtkDelete(pNtkOld);
          Aig_ManStop(pAVar10);
        }
      }
      else {
        pNtk = Abc_NtkFromCellMappedGia(p,local_a4);
      }
      if ((pAbc->pGia->vNamesIn == (Vec_Ptr_t *)0x0) || (pVVar9 = pNtk->vCis, pVVar9->nSize < 1))
      goto LAB_00274add;
      lVar15 = 0;
      break;
    }
    if (iVar7 != 0x65) {
LAB_00274944:
      Abc_Print(-2,"usage: &put [-seovh]\n");
      Abc_Print(-2,"\t         transfer the current network into the old ABC\n");
      pcVar12 = "yes";
      pcVar11 = "yes";
      if (!bVar5) {
        pcVar11 = "no";
      }
      Abc_Print(-2,"\t-s     : toggle clearning verification status [default = %s]\n",pcVar11);
      pcVar11 = "yes";
      if (!bVar4) {
        pcVar11 = "no";
      }
      Abc_Print(-2,"\t-e     : toggle extracting MUXes for flop enables [default = %s]\n",pcVar11);
      pcVar11 = "yes";
      if (local_a4 == 0) {
        pcVar11 = "no";
      }
      Abc_Print(-2,
                "\t-o     : toggles using buffers to decouple combinational outputs [default = %s]\n"
                ,pcVar11);
      if (!bVar6) {
        pcVar12 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar12);
      pcVar11 = "\t-h     : print the command usage\n";
      iVar7 = -2;
LAB_00274a2b:
      Abc_Print(iVar7,pcVar11);
      return 1;
    }
    bVar4 = (bool)(bVar4 ^ 1);
  } while( true );
  do {
    if (lVar15 < pAbc->pGia->vNamesIn->nSize) {
      pAVar2 = (Abc_Obj_t *)pVVar9->pArray[lVar15];
      Nm_ManDeleteIdName(pNtk->pManName,pAVar2->Id);
      pVVar9 = pAbc->pGia->vNamesIn;
      if (pVVar9->nSize <= lVar15) goto LAB_00274e42;
      Abc_ObjAssignName(pAVar2,(char *)pVVar9->pArray[lVar15],(char *)0x0);
    }
    lVar15 = lVar15 + 1;
    pVVar9 = pNtk->vCis;
  } while (lVar15 < pVVar9->nSize);
LAB_00274add:
  if (pAbc->pGia->vNamesOut != (Vec_Ptr_t *)0x0) {
    uVar14 = pNtk->nObjCounts[8];
    if (1 < uVar14) {
      uVar13 = 0;
      uVar8 = uVar14 - 1;
      uVar14 = 0;
      if (uVar8 != 0) {
        do {
          uVar14 = uVar13 + 1;
          bVar4 = 9 < uVar8;
          uVar13 = uVar14;
          uVar8 = uVar8 / 10;
        } while (bVar4);
      }
    }
    pVVar9 = pNtk->vCos;
    if (0 < pVVar9->nSize) {
      lVar15 = 0;
      do {
        if (lVar15 < pAbc->pGia->vNamesOut->nSize) {
          pAVar2 = (Abc_Obj_t *)pVVar9->pArray[lVar15];
          Nm_ManDeleteIdName(pNtk->pManName,pAVar2->Id);
          if ((*(uint *)&pAVar2->field_0x14 & 0xf) == 3) {
            pVVar9 = pAbc->pGia->vNamesOut;
            if (pVVar9->nSize <= lVar15) goto LAB_00274e42;
            pcVar11 = (char *)pVVar9->pArray[lVar15];
            pcVar12 = (char *)0x0;
          }
          else {
            iVar7 = pNtk->vPos->nSize;
            if (lVar15 < iVar7) {
              __assert_fail("i >= Abc_NtkPoNum(pNtk)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abc.c"
                            ,0x7703,"int Abc_CommandAbc9Put(Abc_Frame_t *, int, char **)");
            }
            sprintf(local_98,"_li%0*d",(ulong)uVar14,(ulong)(uint)((int)lVar15 - iVar7));
            pVVar9 = pAbc->pGia->vNamesOut;
            if (pVVar9->nSize <= lVar15) {
LAB_00274e42:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            pcVar11 = (char *)pVVar9->pArray[lVar15];
            pcVar12 = local_98;
          }
          Abc_ObjAssignName(pAVar2,pcVar11,pcVar12);
        }
        lVar15 = lVar15 + 1;
        pVVar9 = pNtk->vCos;
      } while (lVar15 < pVVar9->nSize);
    }
  }
  if ((pAbc->pGia->vNamesIn != (Vec_Ptr_t *)0x0) || (pAbc->pGia->vNamesOut != (Vec_Ptr_t *)0x0)) {
    Abc_NtkRedirectCiCo(pNtk);
  }
  if ((pAbc->pGia->vInArrs != (Vec_Flt_t *)0x0) || (pAbc->pGia->vOutReqs != (Vec_Flt_t *)0x0)) {
    Abc_NtkTimeInitialize(pNtk,(Abc_Ntk_t *)0x0);
    fVar1 = pAbc->pGia->DefInArrs;
    Abc_NtkTimeSetDefaultArrival(pNtk,fVar1,fVar1);
    fVar1 = pAbc->pGia->DefOutReqs;
    Abc_NtkTimeSetDefaultRequired(pNtk,fVar1,fVar1);
    if ((pAbc->pGia->vInArrs != (Vec_Flt_t *)0x0) && (pVVar9 = pNtk->vCis, 0 < pVVar9->nSize)) {
      lVar15 = 0;
      do {
        pVVar3 = pAbc->pGia->vInArrs;
        if (pVVar3->nSize <= lVar15) goto LAB_00274e23;
        fVar1 = pVVar3->pArray[lVar15];
        Abc_NtkTimeSetArrival(pNtk,*(int *)((long)pVVar9->pArray[lVar15] + 0x10),fVar1,fVar1);
        lVar15 = lVar15 + 1;
        pVVar9 = pNtk->vCis;
      } while (lVar15 < pVVar9->nSize);
    }
    if ((pAbc->pGia->vOutReqs != (Vec_Flt_t *)0x0) && (pVVar9 = pNtk->vCos, 0 < pVVar9->nSize)) {
      lVar15 = 0;
      do {
        pVVar3 = pAbc->pGia->vOutReqs;
        if (pVVar3->nSize <= lVar15) {
LAB_00274e23:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                        ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
        }
        fVar1 = pVVar3->pArray[lVar15];
        Abc_NtkTimeSetRequired(pNtk,*(int *)((long)pVVar9->pArray[lVar15] + 0x10),fVar1,fVar1);
        lVar15 = lVar15 + 1;
        pVVar9 = pNtk->vCos;
      } while (lVar15 < pVVar9->nSize);
    }
  }
  Abc_FrameReplaceCurrentNetwork(pAbc,pNtk);
  if (bVar5) {
    Abc_FrameClearVerifStatus(pAbc);
  }
  return 0;
}

Assistant:

int Abc_CommandAbc9Put( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Abc_Ntk_t * Abc_NtkFromDarChoices( Abc_Ntk_t * pNtkOld, Aig_Man_t * pMan );
    extern void Abc_NtkRedirectCiCo( Abc_Ntk_t * pNtk );
    extern Abc_Ntk_t * Abc_NtkFromCellMappedGia( Gia_Man_t * p, int fUseBuffs );
    extern Abc_Ntk_t * Abc_NtkFromMappedGia( Gia_Man_t * p, int fFindEnables, int fUseBuffs );

    Aig_Man_t * pMan;
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int fStatusClear = 1;
    int fFindEnables = 0;
    int fUseBuffs    = 0;
    int c, fVerbose  = 0;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "seovh" ) ) != EOF )
    {
        switch ( c )
        {
        case 's':
            fStatusClear ^= 1;
            break;
        case 'e':
            fFindEnables ^= 1;
            break;
        case 'o':
            fUseBuffs ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( fFindEnables )
        pNtk = Abc_NtkFromMappedGia( pAbc->pGia, 1, fUseBuffs );
    else if ( Gia_ManHasCellMapping(pAbc->pGia) )
        pNtk = Abc_NtkFromCellMappedGia( pAbc->pGia, fUseBuffs );
    else if ( Gia_ManHasMapping(pAbc->pGia) || pAbc->pGia->pMuxes )
        pNtk = Abc_NtkFromMappedGia( pAbc->pGia, 0, fUseBuffs );
    else if ( Gia_ManHasDangling(pAbc->pGia) == 0 )
    {
        pMan = Gia_ManToAig( pAbc->pGia, 0 );
        pNtk = Abc_NtkFromAigPhase( pMan );
        pNtk->pName = Extra_UtilStrsav(pMan->pName);
        Aig_ManStop( pMan );
    }
    else
    {
        Abc_Ntk_t * pNtkNoCh;
//        Abc_Print( -1, "Transforming AIG with %d choice nodes.\n", Gia_ManEquivCountClasses(pAbc->pGia) );
        // create network without choices
        pMan = Gia_ManToAig( pAbc->pGia, 0 );
        pNtkNoCh = Abc_NtkFromAigPhase( pMan );
        pNtkNoCh->pName = Extra_UtilStrsav(pMan->pName);
        Aig_ManStop( pMan );
        // derive network with choices
        pMan = Gia_ManToAig( pAbc->pGia, 1 );
        pNtk = Abc_NtkFromDarChoices( pNtkNoCh, pMan );
        Abc_NtkDelete( pNtkNoCh );
        Aig_ManStop( pMan );
    }
    // transfer PI names to pNtk
    if ( pAbc->pGia->vNamesIn )
    {
        Abc_Obj_t * pObj;
        int i;
        Abc_NtkForEachCi( pNtk, pObj, i ) {
            if (i < Vec_PtrSize(pAbc->pGia->vNamesIn)) {
                Nm_ManDeleteIdName(pNtk->pManName, pObj->Id);
                Abc_ObjAssignName( pObj, (char *)Vec_PtrEntry(pAbc->pGia->vNamesIn, i), NULL );
            }
        }
    }
    // transfer PO names to pNtk
    if ( pAbc->pGia->vNamesOut )
    {
        char pSuffix[100];
        Abc_Obj_t * pObj;
        int i, nDigits = Abc_Base10Log( Abc_NtkLatchNum(pNtk) );
        Abc_NtkForEachCo( pNtk, pObj, i ) {
            if (i < Vec_PtrSize(pAbc->pGia->vNamesOut)) {
                Nm_ManDeleteIdName(pNtk->pManName, pObj->Id);
                if ( Abc_ObjIsPo(pObj) )
                    Abc_ObjAssignName( pObj, (char *)Vec_PtrEntry(pAbc->pGia->vNamesOut, i), NULL );
                else
                {
                    assert( i >= Abc_NtkPoNum(pNtk) );
                    sprintf( pSuffix, "_li%0*d", nDigits, i-Abc_NtkPoNum(pNtk) );
                    Abc_ObjAssignName( pObj, (char *)Vec_PtrEntry(pAbc->pGia->vNamesOut, i), pSuffix );
                }
            }
        }
    }

    // decouple CI/CO with the same name
    if ( pAbc->pGia->vNamesIn || pAbc->pGia->vNamesOut )
        Abc_NtkRedirectCiCo( pNtk );

    // transfer timing information
    if ( pAbc->pGia->vInArrs || pAbc->pGia->vOutReqs )
    {
        Abc_Obj_t * pObj; int i;
        Abc_NtkTimeInitialize( pNtk, NULL );
        Abc_NtkTimeSetDefaultArrival( pNtk, pAbc->pGia->DefInArrs, pAbc->pGia->DefInArrs );
        Abc_NtkTimeSetDefaultRequired( pNtk, pAbc->pGia->DefOutReqs, pAbc->pGia->DefOutReqs );
        if ( pAbc->pGia->vInArrs )
            Abc_NtkForEachCi( pNtk, pObj, i )
                Abc_NtkTimeSetArrival( pNtk, Abc_ObjId(pObj), Vec_FltEntry(pAbc->pGia->vInArrs, i), Vec_FltEntry(pAbc->pGia->vInArrs, i) );
        if ( pAbc->pGia->vOutReqs )
            Abc_NtkForEachCo( pNtk, pObj, i )
                Abc_NtkTimeSetRequired( pNtk, Abc_ObjId(pObj), Vec_FltEntry(pAbc->pGia->vOutReqs, i), Vec_FltEntry(pAbc->pGia->vOutReqs, i) );
    }

    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtk );
    if ( fStatusClear )
        Abc_FrameClearVerifStatus( pAbc );
    return 0;

usage:
    Abc_Print( -2, "usage: &put [-seovh]\n" );
    Abc_Print( -2, "\t         transfer the current network into the old ABC\n" );
    Abc_Print( -2, "\t-s     : toggle clearning verification status [default = %s]\n", fStatusClear? "yes": "no" );
    Abc_Print( -2, "\t-e     : toggle extracting MUXes for flop enables [default = %s]\n", fFindEnables? "yes": "no" );
    Abc_Print( -2, "\t-o     : toggles using buffers to decouple combinational outputs [default = %s]\n", fUseBuffs? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}